

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# decodemv.c
# Opt level: O0

void av1_read_tx_type(AV1_COMMON *cm,MACROBLOCKD *xd,int blk_row,int blk_col,TX_SIZE tx_size,
                     aom_reader *r)

{
  PREDICTION_MODE PVar1;
  long lVar2;
  byte bVar3;
  int iVar4;
  int iVar5;
  undefined1 *puVar6;
  int in_ECX;
  int in_EDX;
  long in_RSI;
  long in_RDI;
  TX_SIZE in_R8B;
  PREDICTION_MODE intra_mode;
  FRAME_CONTEXT *ec_ctx;
  TX_SIZE square_tx_size;
  int eset;
  TxSetType tx_set_type;
  int inter_block;
  int qindex;
  uint8_t *tx_type;
  MB_MODE_INFO *mbmi;
  aom_cdf_prob *in_stack_ffffffffffffff88;
  int (*cdf) [16];
  int in_stack_ffffffffffffff90;
  undefined4 in_stack_ffffffffffffff94;
  
  lVar2 = **(long **)(in_RSI + 0x1eb8);
  puVar6 = (undefined1 *)
           (*(long *)(in_RSI + 0x1ee8) + (long)(in_EDX * *(int *)(in_RSI + 0x1ef0) + in_ECX));
  *puVar6 = 0;
  if (((*(char *)(lVar2 + 0x90) == '\0') &&
      (iVar4 = segfeature_active((segmentation *)(in_RDI + 19000),
                                 (byte)*(undefined2 *)(lVar2 + 0xa7) & 7,'\x06'), iVar4 == 0)) &&
     (*(int *)(in_RSI + 0x29a4 + (ulong)((byte)*(undefined2 *)(lVar2 + 0xa7) & 7) * 4) != 0)) {
    iVar4 = is_inter_block((MB_MODE_INFO *)
                           CONCAT44(in_stack_ffffffffffffff94,in_stack_ffffffffffffff90));
    iVar5 = get_ext_tx_types((TX_SIZE)((uint)in_stack_ffffffffffffff94 >> 0x18),
                             in_stack_ffffffffffffff90,
                             (int)((ulong)in_stack_ffffffffffffff88 >> 0x20));
    if (1 < iVar5) {
      bVar3 = av1_get_ext_tx_set_type(in_R8B,iVar4,(uint)(*(byte *)(in_RDI + 0x1f5) & 1));
      get_ext_tx_set((TX_SIZE)((uint)in_stack_ffffffffffffff94 >> 0x18),in_stack_ffffffffffffff90,
                     (int)((ulong)in_stack_ffffffffffffff88 >> 0x20));
      if (iVar4 == 0) {
        if (*(char *)(lVar2 + 0x5b) == '\0') {
          PVar1 = *(PREDICTION_MODE *)(lVar2 + 2);
        }
        else {
          PVar1 = ""[*(byte *)(lVar2 + 0x5a)];
        }
        cdf = av1_ext_tx_inv + bVar3;
        iVar4 = aom_read_symbol_((aom_reader *)(ulong)CONCAT14(PVar1,in_stack_ffffffffffffff90),
                                 (aom_cdf_prob *)cdf,0);
        *puVar6 = (char)(*cdf)[iVar4];
      }
      else {
        iVar4 = aom_read_symbol_((aom_reader *)
                                 CONCAT44(in_stack_ffffffffffffff94,in_stack_ffffffffffffff90),
                                 in_stack_ffffffffffffff88,0);
        *puVar6 = (char)av1_ext_tx_inv[bVar3][iVar4];
      }
    }
  }
  return;
}

Assistant:

void av1_read_tx_type(const AV1_COMMON *const cm, MACROBLOCKD *xd, int blk_row,
                      int blk_col, TX_SIZE tx_size, aom_reader *r) {
  MB_MODE_INFO *mbmi = xd->mi[0];
  uint8_t *tx_type =
      &xd->tx_type_map[blk_row * xd->tx_type_map_stride + blk_col];
  *tx_type = DCT_DCT;

  // No need to read transform type if block is skipped.
  if (mbmi->skip_txfm ||
      segfeature_active(&cm->seg, mbmi->segment_id, SEG_LVL_SKIP))
    return;

  // No need to read transform type for lossless mode(qindex==0).
  const int qindex = xd->qindex[mbmi->segment_id];
  if (qindex == 0) return;

  const int inter_block = is_inter_block(mbmi);
  if (get_ext_tx_types(tx_size, inter_block, cm->features.reduced_tx_set_used) >
      1) {
    const TxSetType tx_set_type = av1_get_ext_tx_set_type(
        tx_size, inter_block, cm->features.reduced_tx_set_used);
    const int eset =
        get_ext_tx_set(tx_size, inter_block, cm->features.reduced_tx_set_used);
    // eset == 0 should correspond to a set with only DCT_DCT and
    // there is no need to read the tx_type
    assert(eset != 0);

    const TX_SIZE square_tx_size = txsize_sqr_map[tx_size];
    FRAME_CONTEXT *ec_ctx = xd->tile_ctx;
    if (inter_block) {
      *tx_type = av1_ext_tx_inv[tx_set_type][aom_read_symbol(
          r, ec_ctx->inter_ext_tx_cdf[eset][square_tx_size],
          av1_num_ext_tx_set[tx_set_type], ACCT_STR)];
    } else {
      const PREDICTION_MODE intra_mode =
          mbmi->filter_intra_mode_info.use_filter_intra
              ? fimode_to_intradir[mbmi->filter_intra_mode_info
                                       .filter_intra_mode]
              : mbmi->mode;
      *tx_type = av1_ext_tx_inv[tx_set_type][aom_read_symbol(
          r, ec_ctx->intra_ext_tx_cdf[eset][square_tx_size][intra_mode],
          av1_num_ext_tx_set[tx_set_type], ACCT_STR)];
    }
  }
}